

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BatchnormLayerParams::SerializeWithCachedSizes
          (BatchnormLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint64 uVar2;
  float fVar3;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BatchnormLayerParams *this_local;
  
  uVar2 = channels(this);
  if (uVar2 != 0) {
    uVar2 = channels(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar2,output);
  }
  bVar1 = computemeanvar(this);
  if (bVar1) {
    bVar1 = computemeanvar(this);
    google::protobuf::internal::WireFormatLite::WriteBool(5,bVar1,output);
  }
  bVar1 = instancenormalization(this);
  if (bVar1) {
    bVar1 = instancenormalization(this);
    google::protobuf::internal::WireFormatLite::WriteBool(6,bVar1,output);
  }
  fVar3 = epsilon(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = epsilon(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(10,fVar3,output);
  }
  bVar1 = has_gamma(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xf,&this->gamma_->super_MessageLite,output);
  }
  bVar1 = has_beta(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x10,&this->beta_->super_MessageLite,output);
  }
  bVar1 = has_mean(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x11,&this->mean_->super_MessageLite,output);
  }
  bVar1 = has_variance(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x12,&this->variance_->super_MessageLite,output);
  }
  return;
}

Assistant:

void BatchnormLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BatchnormLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 channels = 1;
  if (this->channels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->channels(), output);
  }

  // bool computeMeanVar = 5;
  if (this->computemeanvar() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(5, this->computemeanvar(), output);
  }

  // bool instanceNormalization = 6;
  if (this->instancenormalization() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(6, this->instancenormalization(), output);
  }

  // float epsilon = 10;
  if (this->epsilon() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(10, this->epsilon(), output);
  }

  // .CoreML.Specification.WeightParams gamma = 15;
  if (this->has_gamma()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      15, *this->gamma_, output);
  }

  // .CoreML.Specification.WeightParams beta = 16;
  if (this->has_beta()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      16, *this->beta_, output);
  }

  // .CoreML.Specification.WeightParams mean = 17;
  if (this->has_mean()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      17, *this->mean_, output);
  }

  // .CoreML.Specification.WeightParams variance = 18;
  if (this->has_variance()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      18, *this->variance_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BatchnormLayerParams)
}